

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMarkers::SetUpMarkers(ChLinkMarkers *this,ChMarker *mark1,ChMarker *mark2)

{
  ChBodyFrame *pCVar1;
  
  this->marker1 = mark1;
  if (mark1 == (ChMarker *)0x0) {
    pCVar1 = (ChBodyFrame *)0x0;
  }
  else {
    pCVar1 = &mark1->Body->super_ChBodyFrame;
    if (mark1->Body == (ChBody *)0x0) {
      pCVar1 = (ChBodyFrame *)0x0;
    }
  }
  (this->super_ChLink).Body1 = pCVar1;
  this->marker2 = mark2;
  if (mark2 == (ChMarker *)0x0) {
    pCVar1 = (ChBodyFrame *)0x0;
  }
  else {
    pCVar1 = &mark2->Body->super_ChBodyFrame;
    if (mark2->Body == (ChBody *)0x0) {
      pCVar1 = (ChBodyFrame *)0x0;
    }
  }
  (this->super_ChLink).Body2 = pCVar1;
  return;
}

Assistant:

void ChLinkMarkers::SetUpMarkers(ChMarker* mark1, ChMarker* mark2) {
    // take care of the first link marker
    marker1 = mark1;
    if (mark1)
        Body1 = (ChBodyFrame*)mark1->GetBody();
    else
        Body1 = NULL;

    // take care of the second link marker
    marker2 = mark2;
    if (mark2)
        Body2 = (ChBodyFrame*)mark2->GetBody();
    else
        Body2 = NULL;
}